

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

int main(void)

{
  pointer *this;
  allocator<const_char_*> *this_00;
  int iVar1;
  initializer_list<const_char_*> __l;
  initializer_list<const_char_*> __l_00;
  initializer_list<int> __l_01;
  ulong uVar2;
  bool bVar3;
  _Setw _Var4;
  reference piVar5;
  ostream *poVar6;
  iterator __first;
  iterator __last;
  undefined8 uVar7;
  size_type sVar8;
  reference ppcVar9;
  reference this_01;
  reference pdVar10;
  double *time;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  ulong local_2a0;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  int local_24c;
  ulong local_248;
  size_t i;
  char *local_238;
  char *pcStack_230;
  char *local_228;
  iterator local_218;
  size_type local_210;
  undefined1 local_208 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> structure;
  char *local_1e8;
  char *pcStack_1e0;
  char *local_1d8;
  iterator local_1d0;
  size_type local_1c8;
  undefined1 local_1c0 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> ops;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  res;
  undefined1 local_178 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> eraseable;
  undefined1 local_148 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> findable;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_118;
  const_iterator local_110;
  undefined1 local_108 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> whole;
  vector<unsigned_long,_std::allocator<unsigned_long>_> insertable;
  vector<unsigned_long,_std::allocator<unsigned_long>_> init;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> set;
  Treap<unsigned_long> tp;
  SplayTree<unsigned_long> st;
  iterator iStack_78;
  int n_1;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> n;
  
  n.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
  _4_4_ = 0;
  local_48[0] = 20000;
  local_48[1] = 100000;
  local_48[2] = 500000;
  local_48[3] = 2500000;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l_01._M_len = local_30;
  __l_01._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l_01,&local_49);
  std::allocator<int>::~allocator(&local_49);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_28);
  iStack_78 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_28);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff88);
    if (!bVar3) break;
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    iVar1 = *piVar5;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    poVar6 = std::operator<<(poVar6," elements");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    SplayTree<unsigned_long>::SplayTree((SplayTree<unsigned_long> *)&tp);
    Treap<unsigned_long>::Treap
              ((Treap<unsigned_long> *)&set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    randVec((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            &insertable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(long)iVar1);
    randVec((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            &whole.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(long)(iVar1 / 10));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &insertable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    local_118._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                *)&local_110,&local_118);
    this = &whole.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
    __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
    findable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_108,
                             local_110,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )__first._M_current,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )__last._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &eraseable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
    getRandomPart((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_148,
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &eraseable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(iVar1 / 10));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &eraseable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &res.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
    getRandomPart((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  &res.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(iVar1 / 10));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &res.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    initialize<SplayTree<unsigned_long>,Treap<unsigned_long>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &insertable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,(SplayTree<unsigned_long> *)&tp,
               (Treap<unsigned_long> *)&set._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    run<SplayTree<unsigned_long>,Treap<unsigned_long>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
              ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&ops.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &whole.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_148,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178,
               (SplayTree<unsigned_long> *)&tp,
               (Treap<unsigned_long> *)&set._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_1d8 = "erase";
    local_1e8 = "insert";
    pcStack_1e0 = "find ";
    local_1d0 = &local_1e8;
    local_1c8 = 3;
    this_00 = (allocator<const_char_*> *)
              ((long)&structure.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<const_char_*>::allocator(this_00);
    __l_00._M_len = local_1c8;
    __l_00._M_array = local_1d0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1c0,__l_00,this_00);
    std::allocator<const_char_*>::~allocator
              ((allocator<const_char_*> *)
               ((long)&structure.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_228 = "std::set";
    local_238 = "SplayTree";
    pcStack_230 = "Treap ";
    local_218 = &local_238;
    local_210 = 3;
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)((long)&i + 7));
    __l._M_len = local_210;
    __l._M_array = local_218;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_208,__l,
               (allocator<const_char_*> *)((long)&i + 7));
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)((long)&i + 7));
    uVar7 = std::ostream::operator<<((ostream *)&std::cout,std::left);
    i._6_1_ = std::setfill<char>(' ');
    poVar6 = std::operator<<(uVar7,i._6_1_);
    i._0_4_ = std::setw(0xd);
    poVar6 = std::operator<<(poVar6,i._0_4_);
    std::operator<<(poVar6,"");
    local_248 = 0;
    while( true ) {
      uVar2 = local_248;
      sVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_208);
      if (sVar8 <= uVar2) break;
      local_24c = (int)std::setw(0xd);
      poVar6 = std::operator<<((ostream *)&std::cout,(_Setw)local_24c);
      uVar2 = local_248;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,uVar2,' ',(allocator<char> *)((long)&i_1 + 7));
      ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_208,
                           local_248);
      std::operator+(&local_270,&local_290,*ppcVar9);
      std::operator<<(poVar6,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
      local_248 = local_248 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_2a0 = 0;
    while( true ) {
      sVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_208);
      if (sVar8 <= local_2a0) break;
      _Var4 = std::setw(0xd);
      poVar6 = std::operator<<((ostream *)&std::cout,_Var4);
      ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1c0,
                           local_2a0);
      std::operator<<(poVar6,*ppcVar9);
      this_01 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)&ops.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,local_2a0);
      __end3 = std::vector<double,_std::allocator<double>_>::begin(this_01);
      time = (double *)std::vector<double,_std::allocator<double>_>::end(this_01);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    *)&time);
        if (!bVar3) break;
        pdVar10 = __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator*(&__end3);
        _Var4 = std::setw(0xd);
        poVar6 = std::operator<<((ostream *)&std::cout,_Var4);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pdVar10);
        std::operator<<(poVar6," ");
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator++(&__end3);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      local_2a0 = local_2a0 + 1;
    }
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_208);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1c0);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&ops.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_178);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_148);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &whole.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &insertable.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &init.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    Treap<unsigned_long>::~Treap
              ((Treap<unsigned_long> *)&set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    SplayTree<unsigned_long>::~SplayTree((SplayTree<unsigned_long> *)&tp);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return n.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main() {
  std::vector n{20'000, 100'000, 500'000, 2'500'000};

  for (auto n : n) {
    std::cout << n << " elements" << std::endl;

    SplayTree<std::uint64_t> st;
    Treap<std::uint64_t> tp;
    std::set<std::uint64_t> set;

    auto init = randVec(n);
    auto insertable = randVec(n / 10);

    auto whole = init;
    whole.insert(whole.end(), insertable.begin(), insertable.end());

    auto findable = getRandomPart(whole, n / 10);
    auto eraseable = getRandomPart(whole, n / 10);

    initialize(init, st, tp, set);
    auto res = run(insertable, findable, eraseable, st, tp, set);

    std::vector ops{"insert", "find ", "erase"};
    std::vector structure{"SplayTree", "Treap ", "std::set"};

    std::cout << std::left << std::setfill(' ') << std::setw(13) << "";
    for (std::size_t i = 0; i < structure.size(); ++i)
      std::cout << std::setw(13) << std::string(i, ' ') + structure[i];
    std::cout << std::endl;

    for (std::size_t i = 0; i < structure.size(); ++i) {
      std::cout << std::setw(13) << ops[i];
      for (auto &time : res[i])
        std::cout << std::setw(13) << time << " ";
      std::cout << std::endl;
    }
  }
}